

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O2

void __thiscall
read_writecase::_impl<picnic_params_t>(read_writecase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  int iVar2;
  result_type rVar3;
  ulong uVar4;
  size_type sVar5;
  long lVar6;
  value_expr<bool> local_1899;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  context_frame context_frame_1120;
  assertion_result local_1878;
  value_expr<bool> *local_1860;
  int sk_written;
  int pk_written;
  assertion_result local_1850;
  char *local_1838;
  char *local_1830;
  anon_enum_32 *local_1828;
  size_t signature_len;
  size_t max_signature_size;
  picnic_publickey_t pk2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  array<unsigned_char,_256UL> message;
  const_string local_16a8;
  const_string local_1698;
  const_string local_1688;
  const_string local_1678;
  const_string local_1668;
  const_string local_1658;
  const_string local_1648;
  const_string local_1638;
  const_string local_1628;
  const_string local_1618;
  const_string local_1608;
  const_string local_15f8;
  const_string local_15e8;
  const_string local_15d8;
  const_string local_15c8;
  const_string local_15b8;
  const_string local_15a8;
  const_string local_1598;
  const_string local_1588;
  const_string local_1578;
  const_string local_1568;
  const_string local_1558;
  const_string local_1548;
  const_string local_1538;
  const_string local_1528;
  const_string local_1518;
  const_string local_1508;
  const_string local_14f8;
  const_string local_14e8;
  const_string local_14d8;
  const_string local_14c8;
  const_string local_14b8;
  const_string local_14a8;
  const_string local_1498;
  const_string local_1488;
  const_string local_1478;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  picnic_privatekey_t sk2;
  
  message._M_elems[8] = '\0';
  message._M_elems._0_8_ = &PTR__lazy_ostream_00180480;
  message._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  message._M_elems._24_8_ = anon_var_dwarf_893fa;
  sk.data._0_8_ = picnic_get_param_name(*parameters);
  sk2.data._16_8_ = &message;
  sk2.data[8] = '\0';
  sk2.data._0_8_ = &PTR__lazy_ostream_00182790;
  sk2.data._24_8_ = &sk;
  boost::test_tools::tt_detail::context_frame::context_frame
            (&context_frame_1120,(lazy_ostream *)&sk2);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&context_frame_1120);
  if (bVar1) {
    local_1828 = parameters;
    max_signature_size = picnic_signature_size(*parameters);
    local_1478.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1488.m_begin = "";
    local_1478.m_end = "";
    local_1488.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1478,0x72,&local_1488);
    pk.data._0_8_ = &max_signature_size;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              ((assertion_result *)&message,(value_expr<const_unsigned_long_&> *)&pk,false);
    sk.data._0_8_ = (long)"siglen <= max_signature_size" + 10;
    sk2.data[8] = '\0';
    local_1498.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1498.m_end = "";
    sk.data._8_8_ = (long)"siglen <= max_signature_size" + 0x1c;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = &sk;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&message,(lazy_ostream *)&sk2,&local_1498,0x72,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(message._M_elems + 0x10));
    local_14a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14b8.m_begin = "";
    local_14a8.m_end = "";
    local_14b8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_14a8,0x76,&local_14b8);
    iVar2 = picnic_keygen(*local_1828,&pk,&sk);
    local_1878.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&message,(value_expr<bool> *)&local_1878,false);
    sk2.data._24_8_ = &pk2;
    pk2.data._0_8_ = anon_var_dwarf_109394;
    sk2.data[8] = '\0';
    local_14c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14c8.m_end = "";
    pk2.data._8_8_ = (long)"!picnic_keygen(parameters, &pk, &sk)" + 0x24;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&message,(lazy_ostream *)&sk2,&local_14c8,0x76,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(message._M_elems + 0x10));
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&signature,max_signature_size);
    pk2.data[0] = '\0';
    pk2.data[1] = '\0';
    pk2.data[2] = '\0';
    pk2.data[3] = '\0';
    pk2.data[4] = 0xff;
    pk2.data[5] = '\0';
    pk2.data[6] = '\0';
    pk2.data[7] = '\0';
    signature_len = max_signature_size;
    std::random_device::random_device((random_device *)&sk2);
    uVar4 = std::random_device::_M_getval();
    iVar2 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
    local_1878._0_8_ = ZEXT48(iVar2 + (uint)(iVar2 == 0));
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&pk2,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &local_1878);
      message._M_elems[lVar6] = (uchar)rVar3;
    }
    std::random_device::~random_device((random_device *)&sk2);
    local_14d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14e8.m_begin = "";
    local_14d8.m_end = "";
    local_14e8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_14d8,0x7f,&local_14e8);
    iVar2 = picnic_sign(&sk,&message,0x100,
                        signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,&signature_len);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&pk2,(value_expr<bool> *)&buf,false);
    local_1878._0_8_ =
         "!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len)";
    sk2.data[8] = '\0';
    local_14f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14f8.m_end = "";
    local_1878.m_message.px = (element_type *)0x15eaff;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ =
         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_1878;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pk2,(lazy_ostream *)&sk2,&local_14f8,0x7f,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(pk2.data + 0x10));
    local_1508.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1518.m_begin = "";
    local_1508.m_end = "";
    local_1518.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1508,0x81,&local_1518);
    iVar2 = picnic_verify(&pk,&message,0x100,
                          signature.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,signature_len);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&pk2,(value_expr<bool> *)&buf,false);
    local_1878._0_8_ =
         "!picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len)";
    sk2.data[8] = '\0';
    local_1528.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1528.m_end = "";
    local_1878.m_message.px = (element_type *)0x15eb54;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ =
         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_1878;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pk2,(lazy_ostream *)&sk2,&local_1528,0x81,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(pk2.data + 0x10));
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar5 = picnic_get_public_key_size(*local_1828);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buf,sVar5);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&buf);
    pk_written = picnic_write_public_key
                           (&pk,buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    local_1538.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1548.m_begin = "";
    local_1538.m_end = "";
    local_1548.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1538,0x88,&local_1548);
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffff00000000);
    local_1878._0_8_ = &pk_written;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
    ::evaluate((assertion_result *)&pk2,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                *)&local_1878,false);
    local_1850._0_8_ = "pk_written > 0";
    sk2.data[8] = '\0';
    local_1558.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1558.m_end = "";
    local_1850.m_message.px = (element_type *)0x15eb63;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pk2,(lazy_ostream *)&sk2,&local_1558,0x88,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(pk2.data + 0x10));
    local_1568.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1578.m_begin = "";
    local_1568.m_end = "";
    local_1578.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1568,0x89,&local_1578);
    local_1878.m_message.px =
         (element_type *)
         (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
    local_1878._0_8_ = &pk_written;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
    ::evaluate((assertion_result *)&pk2,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                *)&local_1878,false);
    local_1850._0_8_ = "pk_written <= buf.size()";
    sk2.data[8] = '\0';
    local_1588.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1588.m_end = "";
    local_1850.m_message.px = (element_type *)0x15eb7c;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pk2,(lazy_ostream *)&sk2,&local_1588,0x89,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(pk2.data + 0x10));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buf,(long)pk_written);
    local_1598.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15a8.m_begin = "";
    local_1598.m_end = "";
    local_15a8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1598,0x8d,&local_15a8);
    iVar2 = picnic_read_public_key
                      (&pk2,buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    local_1838._0_1_ = iVar2 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_1878,(value_expr<bool> *)&local_1838,false);
    local_1850._0_8_ = "!picnic_read_public_key(&pk2, buf.data(), buf.size())";
    sk2.data[8] = '\0';
    local_15b8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15b8.m_end = "";
    local_1850.m_message.px = (element_type *)0x15ebb2;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)&sk2,&local_15b8,0x8d,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    local_15c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15d8.m_begin = "";
    local_15c8.m_end = "";
    local_15d8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_15c8,0x8f,&local_15d8);
    iVar2 = picnic_verify(&pk2,&message,0x100,
                          signature.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,signature_len);
    local_1838 = (char *)CONCAT71(local_1838._1_7_,iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_1878,(value_expr<bool> *)&local_1838,false);
    local_1850._0_8_ =
         "!picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len)";
    sk2.data[8] = '\0';
    local_15e8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15e8.m_end = "";
    local_1850.m_message.px = (element_type *)0x15ec08;
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)&sk2,&local_15e8,0x8f,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    sVar5 = picnic_get_private_key_size(*local_1828);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buf,sVar5);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&buf);
    sk_written = picnic_write_private_key
                           (&sk,buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    local_15f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1608.m_begin = "";
    local_15f8.m_end = "";
    local_1608.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_15f8,0x94,&local_1608);
    local_1850.m_message.px = (element_type *)((ulong)local_1850.m_message.px & 0xffffffff00000000);
    local_1850._0_8_ = &sk_written;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
    ::evaluate(&local_1878,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                *)&local_1850,false);
    local_1838 = "sk_written > 0";
    sk2.data[8] = '\0';
    local_1618.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1618.m_end = "";
    local_1830 = "";
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)&sk2,&local_1618,0x94,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    local_1628.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1638.m_begin = "";
    local_1628.m_end = "";
    local_1638.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1628,0x95,&local_1638);
    local_1850.m_message.px =
         (element_type *)
         (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
    local_1850._0_8_ = &sk_written;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
    ::evaluate(&local_1878,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                *)&local_1850,false);
    local_1838 = "sk_written <= buf.size()";
    sk2.data[8] = '\0';
    local_1648.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1648.m_end = "";
    local_1830 = "";
    sk2.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk2.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk2.data._24_8_ = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)&sk2,&local_1648,0x95,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buf,(long)sk_written);
    local_1658.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1668.m_begin = "";
    local_1658.m_end = "";
    local_1668.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1658,0x99,&local_1668);
    iVar2 = picnic_read_private_key
                      (&sk2,buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    local_1899.m_value = iVar2 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_1850,&local_1899,false);
    local_1838 = "!picnic_read_private_key(&sk2, buf.data(), buf.size())";
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffffffffff00);
    local_1678.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1678.m_end = "";
    local_1830 = "";
    local_1878._0_8_ = &PTR__lazy_ostream_001827d0;
    local_1878.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1860 = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1850,(lazy_ostream *)&local_1878,&local_1678,0x99,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::detail::shared_count::~shared_count(&local_1850.m_message.pn);
    local_1688.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1698.m_begin = "";
    local_1688.m_end = "";
    local_1698.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1688,0x9a,&local_1698);
    iVar2 = picnic_validate_keypair(&sk2,&pk2);
    local_1899.m_value = iVar2 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_1850,&local_1899,false);
    local_1838 = "!picnic_validate_keypair(&sk2, &pk2)";
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffffffffff00);
    local_16a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_16a8.m_end = "";
    local_1830 = "";
    local_1878._0_8_ = &PTR__lazy_ostream_001827d0;
    local_1878.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1860 = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1850,(lazy_ostream *)&local_1878,&local_16a8,0x9a,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::detail::shared_count::~shared_count(&local_1850.m_message.pn);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_1120);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(read_write, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature;
    signature.resize(max_signature_size);
    size_t signature_len = max_signature_size;

    std::array<uint8_t, 256> message;
    randomize_container(message);

    BOOST_TEST(!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len));
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len));

    std::vector<uint8_t> buf;
    buf.resize(picnic_get_public_key_size(parameters));
    randomize_container(buf);

    const auto pk_written = picnic_write_public_key(&pk, buf.data(), buf.size());
    BOOST_TEST(pk_written > 0);
    BOOST_TEST(pk_written <= buf.size());
    buf.resize(pk_written);

    picnic_publickey_t pk2;
    BOOST_TEST(!picnic_read_public_key(&pk2, buf.data(), buf.size()));
    BOOST_TEST(
        !picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len));

    buf.resize(picnic_get_private_key_size(parameters));
    randomize_container(buf);
    const auto sk_written = picnic_write_private_key(&sk, buf.data(), buf.size());
    BOOST_TEST(sk_written > 0);
    BOOST_TEST(sk_written <= buf.size());
    buf.resize(sk_written);

    picnic_privatekey_t sk2;
    BOOST_TEST(!picnic_read_private_key(&sk2, buf.data(), buf.size()));
    BOOST_TEST(!picnic_validate_keypair(&sk2, &pk2));
  }
}